

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dungeon.c
# Opt level: O0

void overview_print_branch(char *buf,overview_info *oi)

{
  overview_info *oi_local;
  char *buf_local;
  
  if (oi->portal != '\0') {
    if (oi->portal_dst_known == '\0') {
      sprintf(buf,"      a magic portal");
    }
    else {
      sprintf(buf,"      portal to %s",dungeons + (oi->portal_dst).dnum);
    }
  }
  if (oi->branch != '\0') {
    if (oi->branch_dst_known == '\0') {
      sprintf(buf,"      a long staircase");
    }
    else {
      sprintf(buf,"      stairs to %s",dungeons + (oi->branch_dst).dnum);
    }
  }
  return;
}

Assistant:

static void overview_print_branch(char *buf, const struct overview_info *oi)
{
	if (oi->portal) {
	    if (oi->portal_dst_known) {
		sprintf(buf, "      portal to %s",
			dungeons[oi->portal_dst.dnum].dname);
	    } else {
		sprintf(buf, "      a magic portal");
	    }
	}
	if (oi->branch) {
	    if (oi->branch_dst_known) {
		sprintf(buf, "      stairs to %s",
			dungeons[oi->branch_dst.dnum].dname);
	    } else {
		sprintf(buf, "      a long staircase");
	    }
	}
}